

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

QString * double2string(QString *__return_storage_ptr__,double num,int base,int ndigits,bool *oflow)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QChar *pQVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (base == 1) {
    uVar5 = ndigits;
    do {
      QString::asprintf((char *)&local_58,SUB84(num,0),"%*.*g",(ulong)(uint)ndigits,(ulong)uVar5);
      pDVar1 = (__return_storage_ptr__->d).d;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_58.size;
      local_58.d = pDVar1;
      local_58.ptr = pcVar2;
      local_58.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      qVar3 = QString::indexOf(__return_storage_ptr__,(QChar)0x65,0,CaseSensitive);
      if (0 < qVar3) {
        pQVar4 = QString::data(__return_storage_ptr__);
        if (pQVar4[qVar3 + 1].ucs == L'+') {
          pQVar4 = QString::data(__return_storage_ptr__);
          pQVar4[qVar3].ucs = L' ';
          pQVar4 = QString::data(__return_storage_ptr__);
          pQVar4[qVar3 + 1].ucs = L'e';
        }
      }
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while ((bVar6) && (ndigits < (int)(__return_storage_ptr__->d).size));
    if (oflow == (bool *)0x0) goto LAB_003e8555;
    qVar3 = (__return_storage_ptr__->d).size;
LAB_003e8542:
    bVar6 = ndigits < (int)qVar3;
  }
  else {
    if ((num < 2147483648.0) && (-2147483648.0 <= num)) {
      int2string((QString *)&local_58,(int)num,base,ndigits,(bool *)0x0);
      qVar3 = local_58.size;
      pDVar1 = local_58.d;
      local_58.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      local_58.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_58.size;
      local_58.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (oflow == (bool *)0x0) goto LAB_003e8555;
      goto LAB_003e8542;
    }
    bVar6 = true;
    if (oflow == (bool *)0x0) goto LAB_003e8555;
  }
  *oflow = bVar6;
LAB_003e8555:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString double2string(double num, int base, int ndigits, bool *oflow)
{
    QString s;
    if (base != QLCDNumber::Dec) {
        bool of = num >= 2147483648.0 || num < -2147483648.0;
        if (of) {                             // oops, integer overflow
            if (oflow)
                *oflow = true;
            return s;
        }
        s = int2string((int)num, base, ndigits, nullptr);
    } else {                                    // decimal base
        int nd = ndigits;
        do {
            s = QString::asprintf("%*.*g", ndigits, nd, num);
            qsizetype i = s.indexOf(u'e');
            if (i > 0 && s[i+1]==u'+') {
                s[i] = u' ';
                s[i+1] = u'e';
            }
        } while (nd-- && (int)s.size() > ndigits);
    }
    if (oflow)
        *oflow = (int)s.size() > ndigits;
    return s;
}